

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O0

void __thiscall fasttext::Dictionary::add(Dictionary *this,string *w)

{
  string_view w_00;
  string_view w_01;
  reference pvVar1;
  char *pcVar2;
  vector<fasttext::entry,_std::allocator<fasttext::entry>_> *this_00;
  reference pvVar3;
  string *in_RSI;
  size_t in_RDI;
  entry e;
  int32_t h;
  entry *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  int iVar4;
  undefined4 in_stack_ffffffffffffff5c;
  Dictionary *this_01;
  Dictionary *in_stack_ffffffffffffff70;
  size_t in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  undefined1 local_70 [92];
  int local_14;
  string *local_10;
  
  local_10 = in_RSI;
  local_70._72_16_ = std::__cxx11::string::operator_cast_to_basic_string_view(in_RSI);
  w_01._M_str = in_stack_ffffffffffffff80;
  w_01._M_len = in_stack_ffffffffffffff78;
  local_14 = find(in_stack_ffffffffffffff70,w_01);
  *(long *)(in_RDI + 0x68) = *(long *)(in_RDI + 0x68) + 1;
  pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x10),(long)local_14);
  if (*pvVar1 == -1) {
    this_01 = (Dictionary *)local_70;
    entry::entry(in_stack_ffffffffffffff50);
    std::__cxx11::string::operator=((string *)this_01,local_10);
    local_70._32_8_ = (pointer)0x1;
    pcVar2 = (char *)std::__cxx11::string::operator_cast_to_basic_string_view(local_10);
    w_00._M_str = pcVar2;
    w_00._M_len = in_RDI;
    local_70[0x28] = getType(this_01,w_00);
    std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::push_back
              ((vector<fasttext::entry,_std::allocator<fasttext::entry>_> *)this_01,
               (value_type *)
               CONCAT44(CONCAT13(local_70[0x28],(int3)in_stack_ffffffffffffff5c),
                        in_stack_ffffffffffffff58));
    iVar4 = *(int *)(in_RDI + 0x58);
    *(int *)(in_RDI + 0x58) = iVar4 + 1;
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x10),(long)local_14);
    *pvVar1 = iVar4;
    entry::~entry(in_stack_ffffffffffffff50);
  }
  else {
    this_00 = (vector<fasttext::entry,_std::allocator<fasttext::entry>_> *)(in_RDI + 0x28);
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x10),(long)local_14);
    pvVar3 = std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::operator[]
                       (this_00,(long)*pvVar1);
    pvVar3->count = pvVar3->count + 1;
  }
  return;
}

Assistant:

void Dictionary::add(const std::string& w) {
  int32_t h = find(w);
  ntokens_++;
  if (word2int_[h] == -1) {
    entry e;
    e.word = w;
    e.count = 1;
    e.type = getType(w);
    words_.push_back(e);
    word2int_[h] = size_++;
  } else {
    words_[word2int_[h]].count++;
  }
}